

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O3

void __thiscall IRT::PrintVisitor::Visit(PrintVisitor *this,CJumpConditionalStatement *statement)

{
  mapped_type *pmVar1;
  int id;
  PrintVisitor *this_00;
  initializer_list<const_IRT::INode_*> __l;
  string operationDescription;
  ChildrenAnswers answers;
  vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> children;
  TLogicOperator local_139;
  string local_138;
  vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> local_118;
  ChildrenAnswers local_100;
  string local_d0;
  string local_b0;
  string local_90;
  ChildrenAnswers local_70;
  vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> local_40;
  
  local_100.descriptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CJumpConditionalStatement::LeftOperand(statement);
  local_100.descriptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CJumpConditionalStatement::RightOperand(statement);
  local_100.descriptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)CJumpConditionalStatement::TrueLabel(statement);
  local_100.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CJumpConditionalStatement::FalseLabel(statement);
  __l._M_len = 4;
  __l._M_array = (iterator)&local_100;
  std::vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::vector
            (&local_40,__l,(allocator_type *)&local_138);
  std::vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::vector(&local_118,&local_40)
  ;
  VisitChildren(&local_100,this,&local_118);
  if (local_118.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.
                    super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  id = this->lastVisited + 1;
  this->lastVisited = id;
  local_139 = CJumpConditionalStatement::Operation(statement);
  pmVar1 = std::
           map<IRT::enums::TLogicOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IRT::enums::TLogicOperator>,_std::allocator<std::pair<const_IRT::enums::TLogicOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at((map<IRT::enums::TLogicOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IRT::enums::TLogicOperator>,_std::allocator<std::pair<const_IRT::enums::TLogicOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)maps::logicOperationToString_abi_cxx11_,&local_139);
  this_00 = (PrintVisitor *)(pmVar1->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,this_00,
             (pointer)((long)&(this_00->super_IVisitor)._vptr_IVisitor + pmVar1->_M_string_length));
  ConstructLabel(&local_138,this_00,&local_90,id);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,local_138._M_dataplus._M_p,
             local_138._M_dataplus._M_p + local_138._M_string_length);
  ChildrenAnswers::PushBack(&local_100,&local_b0,id);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_70.descriptions,&local_100.descriptions);
  std::vector<int,_std::allocator<int>_>::vector(&local_70.ids,&local_100.ids);
  AddChildrenAnswers(this,&local_70);
  if (local_70.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_70.descriptions);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"ConditionalJump","");
  AddLabel(this,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  this->lastVisited = this->lastVisited + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if ((CLabelStatement *)
      local_100.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (CLabelStatement *)0x0) {
    operator_delete(local_100.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100.descriptions);
  if (local_40.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.
                    super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void IRT::PrintVisitor::Visit( const IRT::CJumpConditionalStatement &statement ) {
    std::vector<const IRT::INode *> children = { statement.LeftOperand( ), statement.RightOperand( ),
                                                 statement.TrueLabel( ), statement.FalseLabel( ) };
    ChildrenAnswers answers = VisitChildren( children );

    int operationId = ++lastVisited;
    std::string operationDescription = ConstructLabel( IRT::maps::logicOperationToString.at( statement.Operation( )),
                                                       operationId );
    answers.PushBack( operationDescription, operationId );

    AddChildrenAnswers( answers );
    AddLabel( "ConditionalJump" );
    ++lastVisited;
}